

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

Factor * __thiscall libDAI::MaxPlus::beliefF(MaxPlus *this,size_t I)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TFactor<double> *pTVar3;
  reference puVar4;
  undefined4 extraout_var_00;
  Var *this_00;
  undefined4 extraout_var_01;
  VarSet *pVVar5;
  unsigned_long in_RDX;
  MaxPlus *in_RSI;
  Factor *in_RDI;
  size_t r;
  nb_cit J;
  Prob prod_j;
  _ind_t *ind;
  nb_cit j;
  Prob prod;
  Factor *result;
  TProb<double> *in_stack_fffffffffffffe98;
  FactorGraph *in_stack_fffffffffffffea0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffea8;
  MaxPlus *in_stack_fffffffffffffeb0;
  VarSet *in_stack_fffffffffffffeb8;
  TFactor<double> *in_stack_fffffffffffffec0;
  TProb<double> *in_stack_fffffffffffffec8;
  TProb<double> *in_stack_fffffffffffffed0;
  TProb<double> *local_90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78 [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  unsigned_long *local_50;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38 [4];
  unsigned_long local_18;
  NormType norm;
  
  local_18 = in_RDX;
  iVar2 = (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  pTVar3 = (TFactor<double> *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))
                     ((long *)CONCAT44(extraout_var,iVar2),local_18);
  TFactor<double>::p(pTVar3);
  TProb<double>::TProb((TProb<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  FactorGraph::nbF(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  local_38[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe98
                 );
  while( true ) {
    (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
    FactorGraph::nbF(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    local_50 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_38);
    local_58 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               index(in_RSI,(char *)*puVar4,(int)local_18);
    iVar2 = (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_38);
    this_00 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x30))
                               ((long *)CONCAT44(extraout_var_00,iVar2),*puVar4);
    Var::states(this_00);
    TProb<double>::TProb(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(local_38);
    FactorGraph::nbV(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    local_78[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffe98);
    while( true ) {
      (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_38);
      FactorGraph::nbV(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe98)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_78);
      if (*puVar4 != local_18) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_38);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_78);
        newMessage(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8,
                   (size_t)in_stack_fffffffffffffea0);
        TProb<double>::operator*=
                  ((TProb<double> *)in_stack_fffffffffffffec0,
                   (TProb<double> *)in_stack_fffffffffffffeb8);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    }
    local_90 = (TProb<double> *)0x0;
    while (in_stack_fffffffffffffec8 = local_90,
          in_stack_fffffffffffffed0 =
               (TProb<double> *)TProb<double>::size((TProb<double> *)0xbb3c73),
          in_stack_fffffffffffffec8 < in_stack_fffffffffffffed0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (local_58,(size_type)local_90);
      in_stack_fffffffffffffec0 =
           (TFactor<double> *)
           TProb<double>::operator[]
                     ((TProb<double> *)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffeb0 =
           (MaxPlus *)
           (((_Vector_base<double,_std::allocator<double>_> *)
            &(in_stack_fffffffffffffec0->_vs)._vars)->_M_impl).super__Vector_impl_data._M_start;
      in_stack_fffffffffffffeb8 =
           (VarSet *)
           TProb<double>::operator[]
                     ((TProb<double> *)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
      (((vector<double,_std::allocator<double>_> *)&in_stack_fffffffffffffeb8->_vars)->
      super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
           = (pointer)((double)in_stack_fffffffffffffeb0 *
                      (double)(((vector<double,_std::allocator<double>_> *)
                               &in_stack_fffffffffffffeb8->_vars)->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start);
      local_90 = (TProb<double> *)
                 ((long)&(local_90->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    TProb<double>::~TProb((TProb<double> *)0xbb3d1d);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  }
  iVar2 = (*(in_RSI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  pTVar3 = (TFactor<double> *)
           (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x50))
                     ((long *)CONCAT44(extraout_var_01,iVar2),local_18);
  pVVar5 = TFactor<double>::vars(pTVar3);
  norm = (NormType)((ulong)pVVar5 >> 0x20);
  TFactor<double>::TFactor
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (TProb<double> *)in_stack_fffffffffffffeb0);
  TFactor<double>::normalize(pTVar3,norm);
  TProb<double>::~TProb((TProb<double> *)0xbb3e03);
  return in_RDI;
}

Assistant:

Factor MaxPlus::beliefF (size_t I) const {
        Prob prod( grm().factor(I).p() );

        for( FactorGraph::nb_cit j = grm().nbF(I).begin(); j != grm().nbF(I).end(); j++ ) {
            // ind is the precalculated Index(j,I) i.e. to x_I == k corresponds x_j == ind[k]
            const _ind_t *ind = &(index(*j, I));

            // prod_j will be the product of messages coming into j
            Prob prod_j( grm().var(*j).states() ); 
            for( FactorGraph::nb_cit J = grm().nbV(*j).begin(); J != grm().nbV(*j).end(); J++ ) 
                if( *J != I )   // for all J in nb(j) \ I 
                    prod_j *= newMessage(*j,*J);

            // multiply prod with prod_j
            for( size_t r = 0; r < prod.size(); r++ )
                prod[r] *= prod_j[(*ind)[r]];
        }

        Factor result( grm().factor(I).vars(), prod );
        result.normalize();
        
        return( result );

    /*  UNOPTIMIZED VERSION
     
        Factor prod( grm().factor(I) );
        for( FactorGraph::nb_cit i = grm().nbF(I).begin(); i != grm().nbF(I).end(); i++ ) {
            for( FactorGraph::nb_cit J = grm().nbV(*i).begin(); J != grm().nbV(*i).end(); J++ )
                if( *J != I )
                    prod *= Factor( grm().var(*i), newMessage(*i,*J)) );
        }
        return prod.normalized();*/
    }